

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O3

bool __thiscall
ON_SubD::Internal_GetTextureCoordinatesGeometryControlNetMesh
          (ON_SubD *this,ON_SubDLevel *level,ON_Mesh *mesh)

{
  ON_3fVectorArray *this_00;
  ushort uVar1;
  uint *puVar2;
  ON_2dVector ngon_sub_pack_rect_delta_00;
  ON_2dVector ngon_sub_pack_rect_size_00;
  double dVar3;
  ON_UUID OVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ON_SimpleArray<ON_3dPoint> *this_01;
  ON_2fPointArray *this_02;
  ON_SubDFace *this_03;
  ON_SubDVertex *pOVar10;
  ON_MeshNgon *ngon;
  ON_3dPoint *pOVar11;
  uint i_1;
  long lVar12;
  ON_SubDFace *pOVar13;
  uint i;
  uint uVar14;
  ulong new_capacity;
  ON_2dPoint *pOVar15;
  ulong uVar16;
  ON_SimpleArray<ON_3fVector> *this_04;
  uint i_2;
  long lVar17;
  ON_SubDFace *pOVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  ON_2dVector OVar21;
  ON_2dVector ngon_face_pack_rect_size;
  ON_2dVector face_pack_rect_size;
  ON_3dPoint C;
  ON_3fVector N;
  ON_3dPoint faceT [2];
  ON_SimpleArray<ON_3dPoint> P;
  ON_2dVector ngon_sub_pack_rect_delta;
  ON_2dVector ngon_sub_pack_rect_size;
  ON_MappingTag mapping_tag;
  ON_2dPoint quadS [4];
  ON_3dPoint quadP [4];
  ON_2dPoint face_pack_rect_corners [4];
  uint local_308;
  ON_UUID local_2f8;
  double local_2e8;
  ON_SimpleArray<ON_2dPoint> *local_2e0;
  ON_MeshFace local_2d8;
  ON_SimpleArray<ON_3fVector> *local_2c8;
  ON_SimpleArray<ON_MeshFace> *local_2c0;
  ON_3fVector local_2b4;
  ON_SubDFace *local_2a8;
  undefined4 local_29c;
  ON_3dPoint local_298;
  ON_3dPoint local_280;
  undefined1 local_260 [8];
  undefined1 local_258 [16];
  ON_2udex local_248;
  double local_240;
  double local_238;
  ON_SimpleArray<ON_3fVector> *local_230;
  ON_2dVector local_228;
  double local_218;
  double dStack_210;
  ON_SubD *local_200;
  ON_SubDFace *local_1f8;
  ON_2dPoint local_1f0;
  ON_2dVector local_1d8;
  ON_2dVector local_1c8;
  undefined1 local_1b8 [24];
  ON_3dPoint local_1a0;
  double local_188;
  uchar auStack_180 [8];
  double local_178;
  double local_170;
  uchar auStack_168 [8];
  double local_160;
  ON_2dPoint local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  ON_3dPoint local_d8;
  double local_c0;
  uchar auStack_b8 [8];
  double local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  ON_3dPoint local_90;
  ON_2dPoint local_78 [4];
  
  uVar6 = TexturePointsAreSet(this);
  uVar7 = FaceCount(this);
  pOVar13 = level->m_face[0];
  if (pOVar13 != (ON_SubDFace *)0x0) {
    uVar6 = uVar6 * 2;
    bVar5 = false;
    uVar14 = 0;
    uVar19 = 0;
    do {
      uVar8 = ON_SubDFace::EdgeCount(pOVar13);
      if (2 < uVar8) {
        if (!bVar5) {
          if (uVar8 == 4) {
            uVar19 = uVar19 + 1;
            goto LAB_00626a67;
          }
          bVar5 = true;
          uVar14 = uVar19;
          uVar19 = uVar19 * 4;
        }
        uVar14 = (uVar8 == 4) + uVar14;
        uVar19 = uVar19 + uVar8;
      }
LAB_00626a67:
      pOVar13 = pOVar13->m_next_face;
    } while (pOVar13 != (ON_SubDFace *)0x0);
    local_29c = CONCAT31((int3)(uVar8 >> 8),uVar19 != 0);
    if (uVar19 != 0) {
      local_2c0 = &mesh->m_F;
      uVar16 = (ulong)uVar19;
      iVar9 = (mesh->m_F).m_capacity;
      if ((ulong)(long)iVar9 < uVar16) {
        ON_SimpleArray<ON_MeshFace>::SetCapacity(local_2c0,uVar16);
        iVar9 = (mesh->m_F).m_capacity;
      }
      if (-1 < iVar9) {
        (mesh->m_F).m_count = 0;
      }
      local_2c8 = &(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>;
      iVar9 = (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity;
      local_200 = this;
      if ((ulong)(long)iVar9 < uVar16) {
        ON_SimpleArray<ON_3fVector>::SetCapacity(local_2c8,uVar16);
        iVar9 = (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity;
      }
      if (-1 < iVar9) {
        (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
      }
      new_capacity = (ulong)(uVar19 * 4 + uVar14 * -7);
      this_01 = &ON_Mesh::DoublePrecisionVertices(mesh)->super_ON_SimpleArray<ON_3dPoint>;
      iVar9 = this_01->m_capacity;
      if ((ulong)(long)iVar9 < new_capacity) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity(this_01,new_capacity);
        iVar9 = this_01->m_capacity;
      }
      if (-1 < iVar9) {
        this_01->m_count = 0;
      }
      this_00 = &mesh->m_N;
      iVar9 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity;
      if ((ulong)(long)iVar9 < new_capacity) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&this_00->super_ON_SimpleArray<ON_3fVector>,new_capacity);
        iVar9 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity;
      }
      if (-1 < iVar9) {
        (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
      }
      local_2e0 = &(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>;
      iVar9 = (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity;
      if ((ulong)(long)iVar9 < new_capacity) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity(local_2e0,new_capacity);
        iVar9 = (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity;
      }
      if (-1 < iVar9) {
        (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
      }
      iVar9 = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity;
      if ((uVar7 < uVar6) && ((ulong)(long)iVar9 < new_capacity)) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity
                  (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,new_capacity);
        iVar9 = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity;
      }
      if (-1 < iVar9) {
        (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count = 0;
      }
      iVar9 = (mesh->m_F).m_capacity;
      if ((ulong)(long)iVar9 < uVar16) {
        ON_SimpleArray<ON_MeshFace>::SetCapacity(local_2c0,uVar16);
        iVar9 = (mesh->m_F).m_capacity;
      }
      if (-1 < iVar9) {
        (mesh->m_F).m_count = 0;
      }
      iVar9 = (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity;
      if ((ulong)(long)iVar9 < uVar16) {
        ON_SimpleArray<ON_3fVector>::SetCapacity(local_2c8,uVar16);
        iVar9 = (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity;
      }
      if (-1 < iVar9) {
        (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
      }
      dVar3 = ON_DBL_QNAN;
      this_02 = &mesh->m_T;
      if (bVar5) {
        local_218 = ON_2dVector::NanVector.x;
        dStack_210 = ON_2dVector::NanVector.y;
        local_228.x = ON_2dVector::NanVector.x;
        local_228.y = ON_2dVector::NanVector.y;
        local_118.x = ON_2dPoint::NanPoint.x;
        local_118.y = ON_2dPoint::NanPoint.y;
        local_108 = ON_2dPoint::NanPoint.x;
        dStack_100 = ON_2dPoint::NanPoint.y;
        local_f8 = ON_2dPoint::NanPoint.x;
        dStack_f0 = ON_2dPoint::NanPoint.y;
        local_e8 = ON_2dPoint::NanPoint.x;
        dStack_e0 = ON_2dPoint::NanPoint.y;
        local_1b8._16_8_ = ON_3dPoint::NanPoint.z;
        local_1b8._8_8_ = ON_3dPoint::NanPoint.y;
        local_1b8._0_8_ = ON_3dPoint::NanPoint.x;
        local_1a0.x = ON_3dPoint::NanPoint.x;
        local_1a0.y = ON_3dPoint::NanPoint.y;
        local_1a0.z = ON_3dPoint::NanPoint.z;
        local_188 = ON_3dPoint::NanPoint.x;
        auStack_180 = (uchar  [8])ON_3dPoint::NanPoint.y;
        local_178 = ON_3dPoint::NanPoint.z;
        local_170 = ON_3dPoint::NanPoint.x;
        auStack_168 = (uchar  [8])ON_3dPoint::NanPoint.y;
        local_160 = ON_3dPoint::NanPoint.z;
        local_298.z = ON_3dPoint::NanPoint.z;
        local_298.x = ON_3dPoint::NanPoint.x;
        local_298.y = ON_3dPoint::NanPoint.y;
        local_280.x = ON_3dPoint::NanPoint.x;
        local_280.y = ON_3dPoint::NanPoint.y;
        local_280.z = ON_3dPoint::NanPoint.z;
        local_260 = (undefined1  [8])&PTR__ON_SimpleArray_00808fd0;
        local_258 = (undefined1  [16])0x0;
        local_230 = &this_00->super_ON_SimpleArray<ON_3fVector>;
        ON_SimpleArray<ON_3dPoint>::SetCapacity((ON_SimpleArray<ON_3dPoint> *)local_260,0x40);
        pOVar13 = level->m_face[0];
        if (pOVar13 != (ON_SubDFace *)0x0) {
          do {
            uVar1 = pOVar13->m_edge_count;
            this_03 = (ON_SubDFace *)(ulong)uVar1;
            if (2 < uVar1) {
              if (-1 < (int)local_258._12_4_) {
                local_258._8_4_ = 0;
              }
              uVar14 = 0;
              do {
                pOVar10 = ON_SubDFace::Vertex(pOVar13,uVar14);
                local_308 = (uint)uVar1;
                if (pOVar10 == (ON_SubDVertex *)0x0) break;
                ON_SubDVertex::ControlNetPoint((ON_3dPoint *)&local_2f8,pOVar10);
                bVar5 = ON_3dPoint::IsValid((ON_3dPoint *)&local_2f8);
                if (!bVar5) break;
                ON_SubDVertex::ControlNetPoint((ON_3dPoint *)&local_1f0,pOVar10);
                ON_SimpleArray<ON_3dPoint>::Append
                          ((ON_SimpleArray<ON_3dPoint> *)local_260,(ON_3dPoint *)&local_1f0);
                uVar14 = uVar14 + 1;
              } while (local_308 != uVar14);
              if (local_258._8_4_ == local_308) {
                ON_SubDFace::ControlNetCenterPoint((ON_3dPoint *)&local_2f8,pOVar13);
                local_d8.z = local_2e8;
                local_d8.x = (double)local_2f8._0_8_;
                local_d8.y = (double)local_2f8.Data4;
                bVar5 = ON_3dPoint::IsValid(&local_d8);
                if (bVar5) {
                  ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)&local_2f8,pOVar13);
                  ON_3fVector::ON_3fVector(&local_2b4,(ON_3dVector *)&local_2f8);
                  ON_SubDFace::GetFacePackRectCorners(pOVar13,false,local_78);
                  this_04 = local_230;
                  OVar21 = ON_SubDFace::PackRectSize(pOVar13);
                  local_240 = OVar21.y;
                  local_238 = OVar21.x;
                  if (uVar7 < uVar6) {
                    ON_SubDFace::TexturePoint((ON_3dPoint *)&local_2f8,pOVar13,local_308 - 1);
                    local_298.z = local_2e8;
                    local_298.x = (double)local_2f8._0_8_;
                    local_298.y = (double)local_2f8.Data4;
                    ON_SubDFace::TexturePoint((ON_3dPoint *)&local_2f8,pOVar13,0);
                    local_280.z = local_2e8;
                    local_280.x = (double)local_2f8._0_8_;
                    local_280.y = (double)local_2f8.Data4;
                    ON_SubDFace::TextureCenterPoint((ON_3dPoint *)&local_2f8,pOVar13);
                    OVar21.y = local_240;
                    OVar21.x = local_238;
                    local_1b8._16_8_ = local_2e8;
                    local_1b8._0_4_ = local_2f8.Data1;
                    local_1b8._4_2_ = local_2f8.Data2;
                    local_1b8._6_2_ = local_2f8.Data3;
                    local_1b8[8] = local_2f8.Data4[0];
                    local_1b8[9] = local_2f8.Data4[1];
                    local_1b8[10] = local_2f8.Data4[2];
                    local_1b8[0xb] = local_2f8.Data4[3];
                    local_1b8[0xc] = local_2f8.Data4[4];
                    local_1b8[0xd] = local_2f8.Data4[5];
                    local_1b8[0xe] = local_2f8.Data4[6];
                    local_1b8[0xf] = local_2f8.Data4[7];
                  }
                  local_240 = OVar21.y;
                  local_238 = OVar21.x;
                  local_2a8 = pOVar13;
                  if (local_308 == 4) {
                    local_2d8.vi[0] = this_01->m_count;
                    ON_SimpleArray<ON_3dPoint>::Append(this_01,&local_d8);
                    ON_SimpleArray<ON_3fVector>::Append(this_04,&local_2b4);
                    local_1f0 = ON_SubDFace::PackRectOrigin(pOVar13);
                    local_1d8 = ON_SubDFace::PackRectSize(pOVar13);
                    local_1c8 = ::operator*(0.5,&local_1d8);
                    local_2f8 = (ON_UUID)ON_2dPoint::operator+(&local_1f0,&local_1c8);
                    ON_SimpleArray<ON_2dPoint>::Append(local_2e0,(ON_2dPoint *)&local_2f8);
                    if (uVar7 < uVar6) {
                      ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_2f8,(ON_3dPoint *)local_1b8);
                      ON_SimpleArray<ON_2fPoint>::Append
                                (&this_02->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_2f8
                                );
                    }
                    ngon = ON_Mesh::AllocateNgon(mesh,8,4);
                    uVar14 = this_01->m_count;
                    puVar2 = ngon->m_vi;
                    *puVar2 = uVar14;
                    auVar20._0_4_ = uVar14 + 1;
                    auVar20._4_4_ = uVar14 + 2;
                    auVar20._8_4_ = uVar14 + 3;
                    auVar20._12_4_ = uVar14 + 4;
                    *(undefined1 (*) [16])(puVar2 + 1) = auVar20;
                    *(ulong *)(puVar2 + 5) = CONCAT44(uVar14 + 6,uVar14 + 5);
                    puVar2[7] = uVar14 + 7;
                    uVar14 = (mesh->m_F).m_count;
                    puVar2 = ngon->m_fi;
                    *puVar2 = uVar14;
                    *(ulong *)(puVar2 + 1) = CONCAT44(uVar14 + 2,uVar14 + 1);
                    puVar2[3] = uVar14 + 3;
                    lVar17 = 1;
                    pOVar15 = local_78;
                    lVar12 = 0;
                    do {
                      ON_SimpleArray<ON_3dPoint>::Append
                                (this_01,(ON_3dPoint *)((long)(double *)local_258._0_8_ + lVar12));
                      uVar14 = (uint)lVar17 & 3;
                      ON_3dPoint::Midpoint
                                ((ON_3dPoint *)&local_2f8,
                                 (ON_3dPoint *)((long)(double *)local_258._0_8_ + lVar12),
                                 (ON_3dPoint *)(local_258._0_8_ + (ulong)uVar14 * 0x18));
                      ON_SimpleArray<ON_3dPoint>::Append(this_01,(ON_3dPoint *)&local_2f8);
                      ON_SimpleArray<ON_3fVector>::Append(this_04,&local_2b4);
                      ON_SimpleArray<ON_3fVector>::Append(this_04,&local_2b4);
                      ON_SimpleArray<ON_2dPoint>::Append(local_2e0,pOVar15);
                      local_2f8 = (ON_UUID)ON_2dPoint::Midpoint
                                                     (pOVar15,(ON_2dPoint *)
                                                              ((long)&local_78[0].x +
                                                              (ulong)(uVar14 << 4)));
                      ON_SimpleArray<ON_2dPoint>::Append(local_2e0,(ON_2dPoint *)&local_2f8);
                      if (uVar7 < uVar6) {
                        local_298.z = local_280.z;
                        local_298.x = local_280.x;
                        local_298.y = local_280.y;
                        ON_SubDFace::TexturePoint((ON_3dPoint *)&local_2f8,local_2a8,uVar14);
                        local_280.z = local_2e8;
                        local_280.x = (double)local_2f8._0_8_;
                        local_280.y = (double)local_2f8.Data4;
                        ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_2f8,&local_298);
                        ON_SimpleArray<ON_2fPoint>::Append
                                  (&this_02->super_ON_SimpleArray<ON_2fPoint>,
                                   (ON_2fPoint *)&local_2f8);
                        ON_3dPoint::Midpoint((ON_3dPoint *)&local_2f8,&local_298,&local_280);
                        this_04 = local_230;
                        ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_1f0,(ON_3dPoint *)&local_2f8);
                        ON_SimpleArray<ON_2fPoint>::Append
                                  (&this_02->super_ON_SimpleArray<ON_2fPoint>,
                                   (ON_2fPoint *)&local_1f0);
                      }
                      lVar12 = lVar12 + 0x18;
                      pOVar15 = pOVar15 + 1;
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != 5);
                    local_2d8.vi[3] = ngon->m_vi[7];
                    lVar12 = 0;
                    do {
                      local_2d8.vi[2] = ngon->m_vi[lVar12 * 2];
                      local_2d8.vi[1] = local_2d8.vi[3];
                      local_2d8.vi[3] = ngon->m_vi[lVar12 * 2] + 1;
                      ON_SimpleArray<ON_MeshFace>::Append(local_2c0,&local_2d8);
                      ON_SimpleArray<ON_3fVector>::Append(local_2c8,&local_2b4);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    ON_Mesh::AddNgon(mesh,ngon);
                    pOVar13 = local_2a8;
                  }
                  else {
                    ON_3dPoint::Midpoint
                              ((ON_3dPoint *)&local_2f8,
                               (ON_3dPoint *)(local_258._0_8_ + (ulong)(local_308 - 1) * 0x18),
                               (ON_3dPoint *)local_258._0_8_);
                    pOVar11 = &local_90;
                    local_90.z = local_2e8;
                    local_90.x = (double)local_2f8._0_8_;
                    local_90.y = (double)local_2f8.Data4;
                    if (uVar7 < uVar6) {
                      ON_3dPoint::Midpoint((ON_3dPoint *)&local_2f8,&local_298,&local_280);
                      OVar4 = local_2f8;
                      pOVar11 = &local_1a0;
                      local_160 = local_2e8;
                      local_170 = (double)local_2f8._0_8_;
                      auStack_168[0] = local_2f8.Data4[0];
                      auStack_168[1] = local_2f8.Data4[1];
                      auStack_168[2] = local_2f8.Data4[2];
                      auStack_168[3] = local_2f8.Data4[3];
                      auStack_168[4] = local_2f8.Data4[4];
                      auStack_168[5] = local_2f8.Data4[5];
                      auStack_168[6] = local_2f8.Data4[6];
                      auStack_168[7] = local_2f8.Data4[7];
                      local_2f8 = OVar4;
                    }
                    if (uVar1 < 5) {
                      local_248 = ON_2udex::Zero;
                    }
                    else {
                      ngon_face_pack_rect_size.y = local_240;
                      ngon_face_pack_rect_size.x = local_238;
                      local_248 = ON_SubDFace::GetNgonSubPackRectSizeAndDelta
                                            (this_03,(uint)&local_218,ngon_face_pack_rect_size,
                                             &local_228,(ON_2dVector *)pOVar11);
                    }
                    pOVar18 = (ON_SubDFace *)0x0;
                    local_1f8 = this_03;
                    while (pOVar18 != local_1f8) {
                      if (uVar1 == 3) {
                        ON_SubDMeshFragment::Get3gonFaceFragmentPackRectCorners
                                  (false,local_78,(uint)pOVar18,false,&local_118);
                      }
                      else {
                        ngon_sub_pack_rect_size_00.y = dStack_210;
                        ngon_sub_pack_rect_size_00.x = local_218;
                        ngon_sub_pack_rect_delta_00.y = local_228.y;
                        ngon_sub_pack_rect_delta_00.x = local_228.x;
                        face_pack_rect_size.y = local_240;
                        face_pack_rect_size.x = local_238;
                        ON_SubDMeshFragment::GetNgonFaceFragmentPackRectCorners
                                  ((uint)uVar1,(uint)pOVar18,false,local_78,face_pack_rect_size,
                                   local_248,ngon_sub_pack_rect_size_00,ngon_sub_pack_rect_delta_00,
                                   &local_118);
                      }
                      local_b0 = local_90.z;
                      local_c0 = local_90.x;
                      auStack_b8 = (uchar  [8])local_90.y;
                      pOVar11 = (ON_3dPoint *)(local_258._0_8_ + pOVar18 * 0x18);
                      local_98 = pOVar11->z;
                      local_a8 = pOVar11->x;
                      dStack_a0 = pOVar11->y;
                      pOVar18 = (ON_SubDFace *)
                                ((long)&(pOVar18->super_ON_SubDComponentBase).m_subd_point1 + 1);
                      uVar16 = ((ulong)pOVar18 & 0xffffffff) % (ulong)this_03;
                      ON_3dPoint::Midpoint
                                ((ON_3dPoint *)&local_2f8,pOVar11,
                                 (ON_3dPoint *)(local_258._0_8_ + uVar16 * 0x18));
                      local_90.z = local_2e8;
                      local_90.x = (double)local_2f8._0_8_;
                      local_90.y = (double)local_2f8.Data4;
                      if (uVar7 < uVar6) {
                        local_298.z = local_280.z;
                        local_298.x = local_280.x;
                        local_298.y = local_280.y;
                        ON_SubDFace::TexturePoint((ON_3dPoint *)&local_2f8,pOVar13,(uint)uVar16);
                        local_280.z = local_2e8;
                        local_280.x = (double)local_2f8._0_8_;
                        local_280.y = (double)local_2f8.Data4;
                        local_1a0.z = local_160;
                        local_1a0.x = local_170;
                        local_1a0.y = (double)auStack_168;
                        local_178 = local_298.z;
                        local_188 = local_298.x;
                        auStack_180 = (uchar  [8])local_298.y;
                        ON_3dPoint::Midpoint((ON_3dPoint *)&local_2f8,&local_298,&local_280);
                        OVar4 = local_2f8;
                        local_160 = local_2e8;
                        local_170 = (double)local_2f8._0_8_;
                        auStack_168[0] = local_2f8.Data4[0];
                        auStack_168[1] = local_2f8.Data4[1];
                        auStack_168[2] = local_2f8.Data4[2];
                        auStack_168[3] = local_2f8.Data4[3];
                        auStack_168[4] = local_2f8.Data4[4];
                        auStack_168[5] = local_2f8.Data4[5];
                        auStack_168[6] = local_2f8.Data4[6];
                        auStack_168[7] = local_2f8.Data4[7];
                        local_2f8 = OVar4;
                      }
                      local_2d8.vi[0] = this_01->m_count;
                      local_2d8.vi[1] = local_2d8.vi[0] + 1;
                      local_2d8.vi[2] = local_2d8.vi[0] + 2;
                      local_2d8.vi[3] = local_2d8.vi[0] + 3;
                      pOVar15 = &local_118;
                      lVar12 = 0;
                      do {
                        ON_SimpleArray<ON_3dPoint>::Append
                                  (this_01,(ON_3dPoint *)((long)&local_d8.x + lVar12));
                        ON_SimpleArray<ON_3fVector>::Append(this_04,&local_2b4);
                        ON_SimpleArray<ON_2dPoint>::Append(local_2e0,pOVar15);
                        if (uVar7 < uVar6) {
                          ON_2fPoint::ON_2fPoint
                                    ((ON_2fPoint *)&local_2f8,(ON_3dPoint *)(local_1b8 + lVar12));
                          ON_SimpleArray<ON_2fPoint>::Append
                                    (&this_02->super_ON_SimpleArray<ON_2fPoint>,
                                     (ON_2fPoint *)&local_2f8);
                        }
                        lVar12 = lVar12 + 0x18;
                        pOVar15 = pOVar15 + 1;
                      } while (lVar12 != 0x60);
                      ON_SimpleArray<ON_MeshFace>::Append(local_2c0,&local_2d8);
                      pOVar13 = local_2a8;
                      ON_SimpleArray<ON_3fVector>::Append(local_2c8,&local_2b4);
                    }
                  }
                }
              }
            }
            pOVar13 = pOVar13->m_next_face;
          } while (pOVar13 != (ON_SubDFace *)0x0);
        }
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)local_260);
      }
      else {
        pOVar13 = level->m_face[0];
        if (pOVar13 != (ON_SubDFace *)0x0) {
          do {
            if (pOVar13->m_edge_count == 4) {
              local_90.x = dVar3;
              pOVar11 = &local_d8;
              uVar16 = 0;
              do {
                pOVar10 = ON_SubDFace::Vertex(pOVar13,(uint)uVar16);
                if (pOVar10 == (ON_SubDVertex *)0x0) break;
                ON_SubDVertex::ControlNetPoint((ON_3dPoint *)local_1b8,pOVar10);
                pOVar11->z = (double)local_1b8._16_8_;
                pOVar11->x = (double)local_1b8._0_8_;
                pOVar11->y = (double)local_1b8._8_8_;
                bVar5 = ON_3dPoint::IsValid(pOVar11);
                if (!bVar5) break;
                pOVar11 = pOVar11 + 1;
                bVar5 = uVar16 < 3;
                uVar16 = uVar16 + 1;
              } while (bVar5);
              bVar5 = ON_3dPoint::IsValid(&local_90);
              if (bVar5) {
                ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)local_1b8,pOVar13);
                ON_3fVector::ON_3fVector((ON_3fVector *)&local_118,(ON_3dVector *)local_1b8);
                local_2d8.vi[0] = this_01->m_count;
                local_2d8.vi[1] = local_2d8.vi[0] + 1;
                local_2d8.vi[2] = local_2d8.vi[0] + 2;
                local_2d8.vi[3] = local_2d8.vi[0] + 3;
                ON_SimpleArray<ON_MeshFace>::Append(local_2c0,&local_2d8);
                ON_SimpleArray<ON_3fVector>::Append(local_2c8,(ON_3fVector *)&local_118);
                pOVar11 = &local_d8;
                lVar12 = 0;
                do {
                  ON_SimpleArray<ON_3dPoint>::Append(this_01,pOVar11);
                  ON_SimpleArray<ON_3fVector>::Append
                            (&this_00->super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)&local_118);
                  local_1b8._0_16_ =
                       (undefined1  [16])ON_SubDFace::PackRectCorner(pOVar13,false,(uint)lVar12);
                  ON_SimpleArray<ON_2dPoint>::Append(local_2e0,(ON_2dPoint *)local_1b8);
                  if (uVar7 < uVar6) {
                    ON_SubDFace::TexturePoint((ON_3dPoint *)local_1b8,pOVar13,(uint)lVar12);
                    ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_298,(ON_3dPoint *)local_1b8);
                    ON_SimpleArray<ON_2fPoint>::Append
                              (&this_02->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_298);
                  }
                  lVar12 = lVar12 + 1;
                  pOVar11 = pOVar11 + 1;
                } while (lVar12 != 4);
              }
            }
            pOVar13 = pOVar13->m_next_face;
          } while (pOVar13 != (ON_SubDFace *)0x0);
        }
      }
      TextureMappingTag((ON_MappingTag *)local_1b8,local_200,false);
      dVar3 = ON_Interval::ZeroToOne.m_t[1];
      if ((mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == this_01->m_count) {
        *(double *)&mesh->field_0x240 = ON_Interval::ZeroToOne.m_t[0];
        *(double *)&mesh->field_0x248 = dVar3;
        dVar3 = ON_Interval::ZeroToOne.m_t[1];
        *(double *)&mesh->field_0x250 = ON_Interval::ZeroToOne.m_t[0];
        *(double *)&mesh->field_0x258 = dVar3;
        mesh->m_srf_scale[0] = 0.0;
        mesh->m_srf_scale[1] = 0.0;
        dVar3 = ON_Interval::ZeroToOne.m_t[1];
        *(double *)&mesh->field_0x270 = ON_Interval::ZeroToOne.m_t[0];
        *(double *)&mesh->field_0x278 = dVar3;
        dVar3 = ON_Interval::ZeroToOne.m_t[1];
        *(double *)&mesh->field_0x280 = ON_Interval::ZeroToOne.m_t[0];
        *(double *)&mesh->field_0x288 = dVar3;
        mesh->m_packed_tex_rotate = false;
        if (uVar7 < uVar6) goto LAB_0062795a;
        bVar5 = ON_MappingTag::IsSet((ON_MappingTag *)local_1b8);
        if ((!bVar5) ||
           (bVar5 = ON_MappingTag::IsDefaultSurfaceParameterMapping((ON_MappingTag *)local_1b8),
           bVar5)) {
          uVar14 = (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
          uVar19 = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity;
          if (uVar19 < uVar14) {
            ON_SimpleArray<ON_2fPoint>::SetCapacity
                      (&this_02->super_ON_SimpleArray<ON_2fPoint>,(long)(int)uVar14);
            uVar19 = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity;
          }
          if (-1 < (int)uVar19) {
            (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count = 0;
          }
          if (0 < (int)uVar14) {
            lVar12 = 0;
            do {
              ON_2fPoint::ON_2fPoint
                        ((ON_2fPoint *)&local_118,
                         (ON_2dPoint *)
                         ((long)&((mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a)->x + lVar12));
              ON_SimpleArray<ON_2fPoint>::Append
                        (&this_02->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_118);
              lVar12 = lVar12 + 0x10;
            } while ((long)(int)uVar14 * 0x10 != lVar12);
            goto LAB_00627953;
          }
        }
      }
      else {
        ON_SimpleArray<ON_2dPoint>::SetCapacity(local_2e0,0);
        if (local_1b8._16_4_ == srfp_mapping) {
          memcpy(local_1b8,&ON_MappingTag::Unset,0x98);
        }
LAB_00627953:
        if (uVar7 < uVar6) {
LAB_0062795a:
          if ((mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != this_01->m_count) {
            ON_SimpleArray<ON_2fPoint>::SetCapacity(&this_02->super_ON_SimpleArray<ON_2fPoint>,0);
          }
        }
      }
      memcpy(&mesh->m_Ttag,local_1b8,0x98);
      goto LAB_0062799b;
    }
  }
  ON_SubDIncrementErrorCount();
  local_29c = 0;
LAB_0062799b:
  return SUB41(local_29c,0);
}

Assistant:

bool ON_SubD::Internal_GetTextureCoordinatesGeometryControlNetMesh(
  const ON_SubDLevel& level,
  ON_Mesh& mesh
) const
{
  const bool bSetMeshT = 2 * this->TexturePointsAreSet() > this->FaceCount(); // more than half the faces have texture points.

  bool bSubdivide = false; // required if any SubD faces are not quads.
  unsigned mesh_4gon_count = 0;
  unsigned mesh_quad_count = 0;
  for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
  {
    const unsigned n = f->EdgeCount();
    if (n < 3)
      continue;

    if (false == bSubdivide)
    {
      if (4 == n)
      {
        // subdivision is not required and we have another quad face
        ++mesh_quad_count;
        continue;
      }
      // first non-quad SubD face - switch to subdivided case
      bSubdivide = true;

      // each of the previously counted quad faces will generate 9 mesh vertices, 4 mesh faces, and a single ON_MeshNgon.
      mesh_4gon_count = mesh_quad_count;
      mesh_quad_count *= 4;
    }

    // In the subdivided case, each SubD face is represented by n quads in the ON_Mesh.
    if ( 4 == n)
      ++mesh_4gon_count;
    mesh_quad_count += n;
  }

  if (mesh_quad_count < 1)
    return ON_SUBD_RETURN_ERROR(false);

  mesh.m_F.Reserve(mesh_quad_count);
  mesh.m_F.SetCount(0);
  mesh.m_FN.Reserve(mesh_quad_count);
  mesh.m_FN.SetCount(0);

  const unsigned mesh_vertex_count = 4 * (mesh_quad_count - 4* mesh_4gon_count) + 9 * mesh_4gon_count;
  ON_3dPointArray& D = mesh.DoublePrecisionVertices();
  D.Reserve(mesh_vertex_count);
  D.SetCount(0);
  mesh.m_N.Reserve(mesh_vertex_count);
  mesh.m_N.SetCount(0);
  mesh.m_S.Reserve(mesh_vertex_count);
  mesh.m_S.SetCount(0);
  if (bSetMeshT)
    mesh.m_T.Reserve(mesh_vertex_count);
  mesh.m_T.SetCount(0);

  mesh.m_F.Reserve(mesh_quad_count);
  mesh.m_F.SetCount(0);
  mesh.m_FN.Reserve(mesh_quad_count);
  mesh.m_FN.SetCount(0);

  ON_MeshFace mesh_f;
  ON_2dPoint face_pack_rect_corners[4];
  ON_3dPoint quadP[4];
  if (bSubdivide)
  {
    ON_2dVector ngon_sub_pack_rect_size = ON_2dVector::NanVector;
    ON_2dVector ngon_sub_pack_rect_delta = ON_2dVector::NanVector;
    ON_2dPoint quadS[4] = { ON_2dPoint::NanPoint, ON_2dPoint::NanPoint, ON_2dPoint::NanPoint, ON_2dPoint::NanPoint };
    ON_3dPoint quadT[4] = { ON_3dPoint::NanPoint, ON_3dPoint::NanPoint, ON_3dPoint::NanPoint, ON_3dPoint::NanPoint };
    ON_3dPoint faceT[2] = { ON_3dPoint ::NanPoint, ON_3dPoint::NanPoint };


    ON_SimpleArray<ON_3dPoint> P(64);
    for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
    {
      const unsigned n = f->m_edge_count;
      if (n < 3)
        continue;

      P.SetCount(0);
      for (unsigned i = 0; i < n; ++i)
      {
        const ON_SubDVertex* v = f->Vertex(i);
        if (nullptr == v)
          break;
        const ON_3dPoint C = v->ControlNetPoint();
        if (false == C.IsValid())
          break;
        P.Append(v->ControlNetPoint());
      }
      if (n != P.UnsignedCount())
        continue;

      quadP[0] = f->ControlNetCenterPoint();
      if (false == quadP[0].IsValid())
        continue;

      const ON_3fVector N(f->ControlNetCenterNormal());

      f->GetFacePackRectCorners(false, face_pack_rect_corners);
      const ON_2dVector face_pack_rect_size = f->PackRectSize();

      if (bSetMeshT)
      {
        faceT[0] = f->TexturePoint(n - 1);
        faceT[1] = f->TexturePoint(0);
        quadT[0] = f->TextureCenterPoint();
      }


      if (4 == n)
      {
        // An ON_SubDFace quad becomes an ON_Mesh ngon made from 4 ON_Mesh quads.

        // center point
        mesh_f.vi[0] = D.UnsignedCount();
        D.Append(quadP[0]);
        mesh.m_N.Append(N);
        mesh.m_S.Append(f->PackRectOrigin() + 0.5 * f->PackRectSize());
        if (bSetMeshT)
          mesh.m_T.Append(ON_2fPoint(quadT[0]));

        ON_MeshNgon* four_gon = mesh.AllocateNgon(8,4);
        four_gon->m_vi[0] = D.UnsignedCount();
        four_gon->m_vi[1] = four_gon->m_vi[0] + 1;
        four_gon->m_vi[2] = four_gon->m_vi[0] + 2;
        four_gon->m_vi[3] = four_gon->m_vi[0] + 3;
        four_gon->m_vi[4] = four_gon->m_vi[0] + 4;
        four_gon->m_vi[5] = four_gon->m_vi[0] + 5;
        four_gon->m_vi[6] = four_gon->m_vi[0] + 6;
        four_gon->m_vi[7] = four_gon->m_vi[0] + 7;

        four_gon->m_fi[0] = mesh.m_F.UnsignedCount();
        four_gon->m_fi[1] = four_gon->m_fi[0] + 1;
        four_gon->m_fi[2] = four_gon->m_fi[0] + 2;
        four_gon->m_fi[3] = four_gon->m_fi[0] + 3;

        // add 8 boundary vertices
        for (unsigned i = 0; i < 4; ++i)
        {
          D.Append(P[i]);
          D.Append(ON_3dPoint::Midpoint(P[i], P[(i + 1) % 4]));
          mesh.m_N.Append(N);
          mesh.m_N.Append(N);
          mesh.m_S.Append(face_pack_rect_corners[i]);
          mesh.m_S.Append(ON_2dPoint::Midpoint(face_pack_rect_corners[i], face_pack_rect_corners[(i+1)%4]));
          if (bSetMeshT)
          {
            faceT[0] = faceT[1];
            faceT[1] = f->TexturePoint((i + 1) % 4);
            mesh.m_T.Append(ON_2fPoint(faceT[0]));
            mesh.m_T.Append(ON_2fPoint(ON_3dPoint::Midpoint(faceT[0], faceT[1])));
          }
        }

        // add 4 ON_Mesh quads that make up the ON_SubDFace quad
        mesh_f.vi[3] = four_gon->m_vi[7];
        for (unsigned i = 0; i < 4; ++i)
        {
          mesh_f.vi[1] = mesh_f.vi[3];
          mesh_f.vi[2] = four_gon->m_vi[2 * i];
          mesh_f.vi[3] = mesh_f.vi[2] + 1;
          mesh.m_F.Append(mesh_f);
          mesh.m_FN.Append(N);
        }

        // add an ON_MeshNgon that represents the ON_SubDFace quad
        mesh.AddNgon(four_gon);
      }
      else
      {
        quadP[3] = ON_3dPoint::Midpoint(P[n - 1], P[0]);
        if (bSetMeshT)
          quadT[3] = ON_3dPoint::Midpoint(faceT[0], faceT[1]);


        const ON_2udex ngon_grid_size
          = (n >= 5)
          ? ON_SubDFace::GetNgonSubPackRectSizeAndDelta(n, face_pack_rect_size, ngon_sub_pack_rect_size, ngon_sub_pack_rect_delta)
          : ON_2udex::Zero;

        // an ON_Mesh n-gon is not possible because the fake packed surface parameters are not continuous across the ON_SubD face.
        for (unsigned i = 0; i < n; ++i)
        {
          if (3 == n)
          {
            ON_SubDMeshFragment::Get3gonFaceFragmentPackRectCorners(false, face_pack_rect_corners, i, false, quadS);
          }
          else
          {
            ON_SubDMeshFragment::GetNgonFaceFragmentPackRectCorners(
              n,
              i,
              false,
              face_pack_rect_corners,
              face_pack_rect_size,
              ngon_grid_size,
              ngon_sub_pack_rect_size,
              ngon_sub_pack_rect_delta,
              quadS
            );
          }

          quadP[1] = quadP[3];
          quadP[2] = P[i];
          quadP[3] = ON_3dPoint::Midpoint(P[i], P[(i + 1) % n]);
          if (bSetMeshT)
          {
            faceT[0] = faceT[1];
            faceT[1] = f->TexturePoint((i + 1) % n);
            quadT[1] = quadT[3];
            quadT[2] = faceT[0];
            quadT[3] = ON_3dPoint::Midpoint(faceT[0], faceT[1]);
          }

          mesh_f.vi[0] = D.UnsignedCount();
          mesh_f.vi[1] = mesh_f.vi[0] + 1;
          mesh_f.vi[2] = mesh_f.vi[1] + 1;
          mesh_f.vi[3] = mesh_f.vi[2] + 1;

          for (unsigned j = 0; j < 4U; ++j)
          {
            D.Append(quadP[j]);
            mesh.m_N.Append(N);
            mesh.m_S.Append(quadS[j]);
            if (bSetMeshT)
              mesh.m_T.Append(ON_2fPoint(quadT[j]));
          }
          mesh.m_F.Append(mesh_f);
          mesh.m_FN.Append(N);
        }
      }
    }
  }
  else
  {
    // All SubD faces are quads
    for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
    {
      if (4 != f->m_edge_count)
        continue;
      quadP[3].x = ON_DBL_QNAN;
      for (unsigned i = 0; i < 4; ++i)
      {
        const ON_SubDVertex* v = f->Vertex(i);
        if (nullptr == v)
          break;
        quadP[i] = v->ControlNetPoint();
        if (false == quadP[i].IsValid())
          break;
      }
      if (false == quadP[3].IsValid())
        continue;
      const ON_3fVector N(f->ControlNetCenterNormal());
      mesh_f.vi[0] = D.UnsignedCount();
      mesh_f.vi[1] = mesh_f.vi[0] + 1;
      mesh_f.vi[2] = mesh_f.vi[1] + 1;
      mesh_f.vi[3] = mesh_f.vi[2] + 1;
      mesh.m_F.Append(mesh_f);
      mesh.m_FN.Append(N);
      for (unsigned i = 0; i < 4U; ++i)
      {
        D.Append(quadP[i]);
        mesh.m_N.Append(N);
        mesh.m_S.Append(f->PackRectCorner(false, i));
        if (bSetMeshT)
          mesh.m_T.Append(ON_2fPoint(f->TexturePoint(i)));
      }
    }
  }


  ON_MappingTag mapping_tag = this->TextureMappingTag(false);

  if (mesh.m_S.UnsignedCount() != D.UnsignedCount())
  {
    mesh.m_S.Destroy();
    if (ON_TextureMapping::TYPE::srfp_mapping == mapping_tag.m_mapping_type)
      mapping_tag = ON_MappingTag::Unset;
  }
  else
  {
    // set fake surface mapping information
    mesh.m_srf_domain[0] = ON_Interval::ZeroToOne;
    mesh.m_srf_domain[1] = ON_Interval::ZeroToOne;
    mesh.m_srf_scale[0] = 0.0;
    mesh.m_srf_scale[1] = 0.0;
    mesh.m_packed_tex_domain[0] = ON_Interval::ZeroToOne;
    mesh.m_packed_tex_domain[1] = ON_Interval::ZeroToOne;
    mesh.m_packed_tex_rotate = false;

    if (
      false == bSetMeshT
      && (false == mapping_tag.IsSet() || mapping_tag.IsDefaultSurfaceParameterMapping())
      )
    {
      const int count = mesh.m_S.Count();
      mesh.m_T.Reserve(count);
      mesh.m_T.SetCount(0);
      for (int i = 0; i < count; ++i)
        mesh.m_T.Append(ON_2fPoint(mesh.m_S[i]));
    }
  }

  if (bSetMeshT)
  {
    if (mesh.m_T.UnsignedCount() != D.UnsignedCount())
      mesh.m_T.Destroy();
  }
  mesh.m_Ttag = mapping_tag;

  return true;
}